

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMElementNSImpl.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::DOMElementNSImpl::setName
          (DOMElementNSImpl *this,XMLCh *namespaceURI,XMLCh *qualifiedName)

{
  DOMDocument *pDVar1;
  bool bVar2;
  int iVar3;
  XMLCh *pXVar4;
  DOMException *pDVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  XMLCh *local_f8;
  XMLCh *local_f0;
  MemoryManager *local_e0;
  DOMDocumentImpl *local_d0;
  long local_c0;
  MemoryManager *local_b0;
  MemoryManager *local_a0;
  DOMDocumentImpl *local_90;
  long local_80;
  MemoryManager *local_70;
  DOMDocumentImpl *local_60;
  XMLCh *URI;
  int index;
  DOMDocumentImpl *ownerDoc;
  XMLCh *qualifiedName_local;
  XMLCh *namespaceURI_local;
  DOMElementNSImpl *this_local;
  
  pDVar1 = (this->super_DOMElementImpl).fParent.fOwnerDocument;
  if (pDVar1 == (DOMDocument *)0x0) {
    local_60 = (DOMDocumentImpl *)0x0;
  }
  else {
    local_60 = (DOMDocumentImpl *)&pDVar1[-1].super_DOMNode;
  }
  pXVar4 = DOMDocumentImpl::getPooledString(local_60,qualifiedName);
  (this->super_DOMElementImpl).fName = pXVar4;
  iVar3 = DOMDocumentImpl::indexofQualifiedName(qualifiedName);
  if (-1 < iVar3) {
    if (iVar3 == 0) {
      this->fPrefix = (XMLCh *)0x0;
      this->fLocalName = (this->super_DOMElementImpl).fName;
    }
    else {
      pXVar4 = DOMDocumentImpl::getPooledNString(local_60,qualifiedName,(long)iVar3);
      this->fPrefix = pXVar4;
      pXVar4 = DOMDocumentImpl::getPooledString
                         (local_60,(this->super_DOMElementImpl).fName + (long)iVar3 + 1);
      this->fLocalName = pXVar4;
      bVar2 = DOMDocumentImpl::isXMLName(local_60,this->fPrefix);
      if ((!bVar2) || (bVar2 = DOMDocumentImpl::isXMLName(local_60,this->fLocalName), !bVar2)) {
        pDVar5 = (DOMException *)__cxa_allocate_exception(0x28);
        if (this == (DOMElementNSImpl *)0x0) {
          local_b0 = XMLPlatformUtils::fgMemoryManager;
        }
        else {
          iVar3 = (*(this->super_DOMElementImpl).super_DOMElement.super_DOMNode._vptr_DOMNode[0xc])
                            ();
          if (CONCAT44(extraout_var_01,iVar3) == 0) {
            local_c0 = 0;
          }
          else {
            local_c0 = CONCAT44(extraout_var_01,iVar3) + -8;
          }
          if (local_c0 == 0) {
            local_e0 = XMLPlatformUtils::fgMemoryManager;
          }
          else {
            iVar3 = (*(this->super_DOMElementImpl).super_DOMElement.super_DOMNode._vptr_DOMNode[0xc]
                    )();
            if (CONCAT44(extraout_var_02,iVar3) == 0) {
              local_d0 = (DOMDocumentImpl *)0x0;
            }
            else {
              local_d0 = (DOMDocumentImpl *)(CONCAT44(extraout_var_02,iVar3) + -8);
            }
            local_e0 = DOMDocumentImpl::getMemoryManager(local_d0);
          }
          local_b0 = local_e0;
        }
        DOMException::DOMException(pDVar5,0xe,0,local_b0);
        __cxa_throw(pDVar5,&DOMException::typeinfo,DOMException::~DOMException);
      }
    }
    if ((namespaceURI == (XMLCh *)0x0) || (local_f0 = namespaceURI, *namespaceURI == L'\0')) {
      local_f0 = (XMLCh *)0x0;
    }
    pXVar4 = DOMNodeImpl::mapPrefix(this->fPrefix,local_f0,1);
    if (pXVar4 == (XMLCh *)0x0) {
      local_f8 = (XMLCh *)0x0;
    }
    else {
      local_f8 = DOMDocumentImpl::getPooledString(local_60,pXVar4);
    }
    this->fNamespaceURI = local_f8;
    return;
  }
  pDVar5 = (DOMException *)__cxa_allocate_exception(0x28);
  if (this == (DOMElementNSImpl *)0x0) {
    local_70 = XMLPlatformUtils::fgMemoryManager;
  }
  else {
    iVar3 = (*(this->super_DOMElementImpl).super_DOMElement.super_DOMNode._vptr_DOMNode[0xc])();
    if (CONCAT44(extraout_var,iVar3) == 0) {
      local_80 = 0;
    }
    else {
      local_80 = CONCAT44(extraout_var,iVar3) + -8;
    }
    if (local_80 == 0) {
      local_a0 = XMLPlatformUtils::fgMemoryManager;
    }
    else {
      iVar3 = (*(this->super_DOMElementImpl).super_DOMElement.super_DOMNode._vptr_DOMNode[0xc])();
      if (CONCAT44(extraout_var_00,iVar3) == 0) {
        local_90 = (DOMDocumentImpl *)0x0;
      }
      else {
        local_90 = (DOMDocumentImpl *)(CONCAT44(extraout_var_00,iVar3) + -8);
      }
      local_a0 = DOMDocumentImpl::getMemoryManager(local_90);
    }
    local_70 = local_a0;
  }
  DOMException::DOMException(pDVar5,0xe,0,local_70);
  __cxa_throw(pDVar5,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

void DOMElementNSImpl::setName(const XMLCh *namespaceURI,
                               const XMLCh *qualifiedName)
{
    DOMDocumentImpl* ownerDoc = (DOMDocumentImpl *) fParent.fOwnerDocument;
    this->fName = ownerDoc->getPooledString(qualifiedName);

    int index = DOMDocumentImpl::indexofQualifiedName(qualifiedName);
    if (index < 0)
        throw DOMException(DOMException::NAMESPACE_ERR, 0, GetDOMNodeMemoryManager);

    if (index == 0)
    {
        //qualifiedName contains no ':'
        //
        fPrefix = 0;
        fLocalName = fName;
    }
    else
    {	//0 < index < this->name.length()-1
        //
        fPrefix = ownerDoc->getPooledNString(qualifiedName, index);
        fLocalName = ownerDoc->getPooledString(fName+index+1);

        // Before we carry on, we should check if the prefix or localName are valid XMLName
        if (!ownerDoc->isXMLName(fPrefix) || !ownerDoc->isXMLName(fLocalName))
          throw DOMException(DOMException::NAMESPACE_ERR, 0, GetDOMNodeMemoryManager);
    }

    // DOM Level 3: namespace URI is never empty string.
    //
    const XMLCh * URI = DOMNodeImpl::mapPrefix (
      fPrefix,
      (!namespaceURI || !*namespaceURI) ? 0 : namespaceURI,
      DOMNode::ELEMENT_NODE);

    fNamespaceURI = (URI == 0) ? 0 : ownerDoc->getPooledString(URI);
}